

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O3

void __thiscall amrex::FabArray<amrex::CutFab>::FabArray(FabArray<amrex::CutFab> *this)

{
  int iVar1;
  int iVar2;
  
  FabArrayBase::FabArrayBase(&this->super_FabArrayBase);
  (this->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__FabArray_00714ec8;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::CutFab>,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::CutFab>_*,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::CutFab>_*,_false>._M_head_impl =
       (FabFactory<amrex::CutFab> *)0x0;
  (this->m_dallocator).m_arena = (Arena *)0x0;
  this->define_function_called = false;
  (this->m_fabs_v).super__Vector_base<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hp_arrays = (void *)0x0;
  (this->m_arrays).hp = (Array4<double> *)0x0;
  (this->m_const_arrays).hp = (Array4<const_double> *)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->shmem).n_values = 0;
  (this->shmem).n_points = 0;
  (this->fbd)._M_t.
  super___uniq_ptr_impl<amrex::FBData<amrex::CutFab>,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::CutFab>_*,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::CutFab>_*,_false>._M_head_impl =
       (FBData<amrex::CutFab> *)0x0;
  (this->pcd)._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::CutFab>_*,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::CutFab>_*,_false>._M_head_impl =
       (PCData<amrex::CutFab> *)0x0;
  (this->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::CutFab>,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::CutFab>_*,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::CutFab>_*,_false>._M_head_impl =
       (FabArray<amrex::CutFab> *)0x0;
  iVar1 = FabArrayBase::m_FA_stats;
  FabArrayBase::m_FA_stats = FabArrayBase::m_FA_stats + 1;
  DAT_0071b050 = DAT_0071b050 + 1;
  iVar2 = FabArrayBase::m_FA_stats;
  if (iVar1 < DAT_0071b044) {
    iVar2 = DAT_0071b044;
  }
  DAT_0071b044 = iVar2;
  return;
}

Assistant:

FabArray<FAB>::FabArray () noexcept
    : shmem()
{
    m_FA_stats.recordBuild();
}